

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggwave.cpp
# Opt level: O1

void __thiscall GGWave::GGWave(GGWave *this,Parameters *parameters)

{
  this->m_sampleRateInp = -1.0;
  this->m_sampleRateOut = -1.0;
  this->m_sampleRate = -1.0;
  this->m_samplesPerFrame = -1;
  this->m_isamplesPerFrame = -1.0;
  this->m_sampleSizeInp = -1;
  this->m_sampleSizeOut = -1;
  this->m_sampleFormatInp = GGWAVE_SAMPLE_FORMAT_UNDEFINED;
  this->m_sampleFormatOut = GGWAVE_SAMPLE_FORMAT_UNDEFINED;
  this->m_hzPerSample = -1.0;
  this->m_ihzPerSample = -1.0;
  this->m_freqDelta_bin = -1;
  this->m_freqDelta_hz = -1.0;
  this->m_nBitsInMarker = -1;
  this->m_nMarkerFrames = -1;
  this->m_encodedDataOffset = -1;
  this->m_soundMarkerThreshold = -1.0;
  this->m_isFixedPayloadLength = false;
  this->m_payloadLength = -1;
  (this->m_dataEncoded).m_data = (uchar *)0x0;
  (this->m_dataEncoded).m_size = 0;
  (this->m_workRSLength).m_data = (uchar *)0x0;
  (this->m_workRSLength).m_size = 0;
  (this->m_workRSData).m_data = (uchar *)0x0;
  (this->m_workRSData).m_size = 0;
  (this->m_rx).receiving = false;
  (this->m_rx).analyzing = false;
  (this->m_rx).fftWorkI.m_data = (int *)0x0;
  (this->m_rx).fftWorkI.m_size = 0;
  (this->m_rx).fftWorkF.m_data = (float *)0x0;
  (this->m_rx).fftWorkF.m_size = 0;
  (this->m_rx).hasNewRxData = false;
  (this->m_rx).hasNewSpectrum = false;
  (this->m_rx).hasNewAmplitude = false;
  (this->m_rx).spectrum.m_data = (float *)0x0;
  (this->m_rx).spectrum.m_size = 0;
  (this->m_rx).amplitude.m_data = (float *)0x0;
  (this->m_rx).amplitude.m_size = 0;
  (this->m_rx).amplitudeResampled.m_data = (float *)0x0;
  (this->m_rx).amplitudeResampled.m_size = 0;
  (this->m_rx).amplitudeTmp.m_data = (uchar *)0x0;
  (this->m_rx).amplitudeTmp.m_size = 0;
  (this->m_rx).dataLength = 0;
  (this->m_rx).data.m_data = (uchar *)0x0;
  (this->m_rx).data.m_size = 0;
  (this->m_rx).historyId = 0;
  (this->m_rx).amplitudeAverage.m_data = (float *)0x0;
  (this->m_rx).amplitudeAverage.m_size = 0;
  (this->m_rx).historyIdFixed = 0;
  (this->m_rx).detectedTones.m_data = (uchar *)0x0;
  (this->m_rx).detectedTones.m_size = 0;
  *(undefined8 *)&(this->m_rx).samplesNeeded = 0;
  *(undefined8 *)((long)&(this->m_rx).fftOut.m_data + 4) = 0;
  (this->m_rx).framesLeftToAnalyze = 0;
  (this->m_rx).framesLeftToRecord = 0;
  (this->m_rx).framesToAnalyze = 0;
  (this->m_rx).framesToRecord = 0;
  (this->m_rx).nMarkersSuccess = 0;
  (this->m_rx).markerFreqStart = 0;
  (this->m_rx).recvDuration_frames = 0;
  (this->m_rx).minFreqStart = 0;
  (this->m_rx).amplitudeHistory.m_data = (float *)0x0;
  (this->m_rx).amplitudeHistory.m_size0 = 0;
  (this->m_rx).amplitudeHistory.m_size1 = 0;
  *(undefined8 *)&(this->m_rx).amplitudeHistory.m_size1 = 0;
  *(undefined8 *)((long)&(this->m_rx).amplitudeRecorded.m_data + 4) = 0;
  (this->m_rx).spectrumHistoryFixed.m_data = (uchar *)0x0;
  (this->m_rx).spectrumHistoryFixed.m_size0 = 0;
  (this->m_rx).spectrumHistoryFixed.m_size1 = 0;
  *(undefined8 *)&(this->m_rx).spectrumHistoryFixed.m_size1 = 0;
  *(undefined8 *)((long)&(this->m_rx).detectedBins.m_data + 4) = 0;
  (this->m_tx).hasData = false;
  this->m_isRxEnabled = false;
  this->m_isTxEnabled = false;
  this->m_needResampling = false;
  this->m_txOnlyTones = false;
  this->m_isDSSEnabled = false;
  (this->m_tx).sendVolume = 0.1;
  (this->m_tx).phaseOffsets.m_data = (double *)0x0;
  (this->m_tx).phaseOffsets.m_size = 0;
  (this->m_tx).output.m_data = (float *)0x0;
  (this->m_tx).output.m_size = 0;
  (this->m_tx).outputResampled.m_data = (float *)0x0;
  (this->m_tx).outputResampled.m_size = 0;
  (this->m_tx).outputTmp.m_data = (uchar *)0x0;
  (this->m_tx).outputTmp.m_size = 0;
  (this->m_tx).dataBits.m_size = 0;
  (this->m_tx).dataLength = 0;
  (this->m_tx).lastAmplitudeSize = 0;
  (this->m_tx).dataBits.m_data = (bool *)0x0;
  *(undefined8 *)&(this->m_tx).bit0Amplitude.m_size1 = 0;
  *(undefined8 *)((long)&(this->m_tx).data.m_data + 4) = 0;
  (this->m_tx).bit0Amplitude.m_data = (float *)0x0;
  (this->m_tx).bit0Amplitude.m_size0 = 0;
  (this->m_tx).bit0Amplitude.m_size1 = 0;
  (this->m_tx).bit1Amplitude.m_data = (float *)0x0;
  (this->m_tx).bit1Amplitude.m_size0 = 0;
  (this->m_tx).bit1Amplitude.m_size1 = 0;
  ggvector<short>::ggvector(&(this->m_tx).outputI16);
  (this->m_tx).nTones = 0;
  (this->m_tx).tones.m_data = (char *)0x0;
  (this->m_tx).tones.m_size = 0;
  Resampler::Resampler(&this->m_resampler);
  this->m_heap = (void *)0x0;
  this->m_heapSize = 0;
  prepare(this,parameters,true);
  return;
}

Assistant:

GGWave::GGWave(const Parameters & parameters) {
    prepare(parameters);
}